

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

void __thiscall duckdb::QueryProfiler::Flush(QueryProfiler *this,OperatorProfiler *profiler)

{
  ProfilingInfo *this_00;
  ProfilingInfo *this_01;
  _Hash_node_base this_02;
  long lVar1;
  table_function_cardinality_t p_Var2;
  ClientContext *pCVar3;
  bool bVar4;
  iterator iVar5;
  PhysicalTableScan *pPVar6;
  pointer pNVar7;
  __node_base *p_Var8;
  profiler_settings_t *settings;
  unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> cardinality;
  
  ::std::mutex::lock(&this->lock);
  if (((this->is_explain_analyze != false) || ((this->context->config).enable_profiler == true)) &&
     (this->running == true)) {
    p_Var8 = &(profiler->operator_infos)._M_h._M_before_begin;
    settings = &profiler->settings;
    this_00 = &(this->query_info).query_global_info;
    while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
      this_02._M_nxt = p_Var8[1]._M_nxt;
      cardinality.
      super_unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>._M_t.
      super___uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>
      .super__Head_base<0UL,_duckdb::NodeStatistics_*,_false>._M_head_impl =
           (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)
           (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)
           this_02._M_nxt;
      iVar5 = ::std::
              _Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::ProfilingNode>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::ProfilingNode>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->tree_map)._M_h,(key_type *)&cardinality);
      lVar1 = *(long *)((long)iVar5.
                              super__Node_iterator_base<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::ProfilingNode>_>,_true>
                              ._M_cur + 0x10);
      bVar4 = ProfilingInfo::Enabled(settings,OPERATOR_TIMING);
      this_01 = (ProfilingInfo *)(lVar1 + 8);
      if (bVar4) {
        ProfilingInfo::MetricSum<double>(this_01,OPERATOR_TIMING,(double *)(p_Var8 + 6));
      }
      bVar4 = ProfilingInfo::Enabled(settings,OPERATOR_CARDINALITY);
      if (bVar4) {
        ProfilingInfo::MetricSum<unsigned_long>
                  (this_01,OPERATOR_CARDINALITY,(unsigned_long *)(p_Var8 + 7));
      }
      bVar4 = ProfilingInfo::Enabled(settings,OPERATOR_ROWS_SCANNED);
      if (bVar4 && *(PhysicalOperatorType *)(this_02._M_nxt + 1) == TABLE_SCAN) {
        pPVar6 = PhysicalOperator::Cast<duckdb::PhysicalTableScan>
                           ((PhysicalOperator *)this_02._M_nxt);
        if (((pPVar6->bind_data).
             super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t
             .
             super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl !=
             (FunctionData *)0x0) &&
           (p_Var2 = (pPVar6->function).cardinality, p_Var2 != (table_function_cardinality_t)0x0)) {
          pCVar3 = this->context;
          unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
          operator*(&pPVar6->bind_data);
          (*p_Var2)((ClientContext *)&cardinality,(FunctionData *)pCVar3);
          if (cardinality.
              super_unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>
              .super__Head_base<0UL,_duckdb::NodeStatistics_*,_false>._M_head_impl !=
              (__uniq_ptr_data<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true,_true>
               )0x0) {
            pNVar7 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                     ::operator->(&cardinality);
            if (pNVar7->has_estimated_cardinality == true) {
              pNVar7 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                       ::operator->(&cardinality);
              ProfilingInfo::MetricSum<unsigned_long>
                        (this_01,OPERATOR_ROWS_SCANNED,&pNVar7->estimated_cardinality);
            }
          }
          ::std::unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>::
          ~unique_ptr(&cardinality.
                       super_unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>
                     );
        }
      }
      bVar4 = ProfilingInfo::Enabled(settings,RESULT_SET_SIZE);
      if (bVar4) {
        ProfilingInfo::MetricSum<unsigned_long>
                  (this_01,RESULT_SET_SIZE,(unsigned_long *)(p_Var8 + 8));
      }
      bVar4 = ProfilingInfo::Enabled(settings,EXTRA_INFO);
      if (bVar4) {
        InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=((InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(lVar1 + 0xb0),
                    (InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(p_Var8 + 0xb));
      }
      bVar4 = ProfilingInfo::Enabled(settings,SYSTEM_PEAK_BUFFER_MEMORY);
      if (bVar4) {
        ProfilingInfo::MetricMax<unsigned_long>
                  (this_00,SYSTEM_PEAK_BUFFER_MEMORY,(unsigned_long *)(p_Var8 + 9));
      }
      bVar4 = ProfilingInfo::Enabled(settings,SYSTEM_PEAK_TEMP_DIR_SIZE);
      if (bVar4) {
        ProfilingInfo::MetricMax<unsigned_long>
                  (this_00,SYSTEM_PEAK_TEMP_DIR_SIZE,(unsigned_long *)(p_Var8 + 10));
      }
    }
    ::std::
    _Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&(profiler->operator_infos)._M_h);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return;
}

Assistant:

void QueryProfiler::Flush(OperatorProfiler &profiler) {
	lock_guard<std::mutex> guard(lock);
	if (!IsEnabled() || !running) {
		return;
	}
	for (auto &node : profiler.operator_infos) {
		auto &op = node.first.get();
		auto entry = tree_map.find(op);
		D_ASSERT(entry != tree_map.end());

		auto &tree_node = entry->second.get();
		auto &info = tree_node.GetProfilingInfo();

		if (ProfilingInfo::Enabled(profiler.settings, MetricsType::OPERATOR_TIMING)) {
			info.MetricSum<double>(MetricsType::OPERATOR_TIMING, node.second.time);
		}
		if (ProfilingInfo::Enabled(profiler.settings, MetricsType::OPERATOR_CARDINALITY)) {
			info.MetricSum<idx_t>(MetricsType::OPERATOR_CARDINALITY, node.second.elements_returned);
		}
		if (ProfilingInfo::Enabled(profiler.settings, MetricsType::OPERATOR_ROWS_SCANNED)) {
			if (op.type == PhysicalOperatorType::TABLE_SCAN) {
				auto &scan_op = op.Cast<PhysicalTableScan>();
				auto &bind_data = scan_op.bind_data;

				if (bind_data && scan_op.function.cardinality) {
					auto cardinality = scan_op.function.cardinality(context, &(*bind_data));
					if (cardinality && cardinality->has_estimated_cardinality) {
						info.MetricSum<idx_t>(MetricsType::OPERATOR_ROWS_SCANNED, cardinality->estimated_cardinality);
					}
				}
			}
		}
		if (ProfilingInfo::Enabled(profiler.settings, MetricsType::RESULT_SET_SIZE)) {
			info.MetricSum<idx_t>(MetricsType::RESULT_SET_SIZE, node.second.result_set_size);
		}
		if (ProfilingInfo::Enabled(profiler.settings, MetricsType::EXTRA_INFO)) {
			info.extra_info = node.second.extra_info;
		}
		if (ProfilingInfo::Enabled(profiler.settings, MetricsType::SYSTEM_PEAK_BUFFER_MEMORY)) {
			query_info.query_global_info.MetricMax(MetricsType::SYSTEM_PEAK_BUFFER_MEMORY,
			                                       node.second.system_peak_buffer_manager_memory);
		}
		if (ProfilingInfo::Enabled(profiler.settings, MetricsType::SYSTEM_PEAK_TEMP_DIR_SIZE)) {
			query_info.query_global_info.MetricMax(MetricsType::SYSTEM_PEAK_TEMP_DIR_SIZE,
			                                       node.second.system_peak_temp_directory_size);
		}
	}
	profiler.operator_infos.clear();
}